

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall cmFileAPI::BuildReplyIndex(Value *__return_storage_ptr__,cmFileAPI *this)

{
  Value *pVVar1;
  Value *this_00;
  _Base_ptr p_Var2;
  Value VStack_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  BuildCMake(&VStack_58,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"cmake");
  Json::Value::operator=(pVVar1,&VStack_58);
  Json::Value::~Value(&VStack_58);
  BuildReply(&VStack_58,this,&this->TopQuery);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"reply");
  pVVar1 = Json::Value::operator=(pVVar1,&VStack_58);
  Json::Value::~Value(&VStack_58);
  for (p_Var2 = (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    BuildClientReply(&VStack_58,this,(ClientQuery *)(p_Var2 + 2));
    this_00 = Json::Value::operator[](pVVar1,(String *)(p_Var2 + 1));
    Json::Value::operator=(this_00,&VStack_58);
    Json::Value::~Value(&VStack_58);
  }
  Json::Value::Value(&VStack_58,arrayValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"objects");
  pVVar1 = Json::Value::operator=(pVVar1,&VStack_58);
  Json::Value::~Value(&VStack_58);
  for (p_Var2 = (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Json::Value::append(pVVar1,(Value *)&p_Var2[1]._M_left);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReplyIndex()
{
  Json::Value index(Json::objectValue);

  // Report information about this version of CMake.
  index["cmake"] = this->BuildCMake();

  // Reply to all queries that we loaded.
  Json::Value& reply = index["reply"] = this->BuildReply(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    std::string const& clientName = client.first;
    ClientQuery const& clientQuery = client.second;
    reply[clientName] = this->BuildClientReply(clientQuery);
  }

  // Move our index of generated objects into its field.
  Json::Value& objects = index["objects"] = Json::arrayValue;
  for (auto& entry : this->ReplyIndexObjects) {
    objects.append(std::move(entry.second)); // NOLINT(*)
  }

  return index;
}